

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PL_approximation.h
# Opt level: O3

VectorXd __thiscall
Gudhi::coxeter_triangulation::
PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
::operator()(PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
             *this,VectorXd *p)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  *pPVar4;
  long lVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  undefined8 *puVar8;
  ulong uVar9;
  double *pdVar10;
  char *__function;
  Matrix<double,__1,_1,_0,__1,_1> *in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar11;
  long lVar12;
  double *pdVar13;
  bool bVar14;
  VectorXd VVar15;
  MatrixXd vertex_matrix;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin0;
  MatrixXd matrix;
  VectorXd pt_v;
  vector<int,_std::allocator<int>_> v;
  VectorXd lambda;
  VectorXd fun_v;
  Simplex_handle s;
  DenseStorage<double,__1,__1,__1,_0> local_208;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1e8;
  DenseStorage<double,__1,__1,__1,_0> local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_198;
  undefined1 local_190 [16];
  vector<int,_std::allocator<int>_> local_180;
  undefined1 local_168 [32];
  double *local_148;
  byte local_140;
  Matrix<double,__1,_1,_0,__1,_1> *local_138;
  PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  *local_130;
  double *local_128;
  VectorXd *local_120;
  Vertex_handle *local_118;
  undefined1 local_110 [32];
  double *local_f0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_e8;
  undefined1 local_d0 [48];
  const_iterator local_a0;
  const_iterator cStack_98;
  vector<int,_std::allocator<int>_> local_90;
  bool local_78;
  undefined7 uStack_77;
  void *local_68;
  
  pdVar1 = (double *)
           (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  pdVar2 = p[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_118 = (Vertex_handle *)(p + 3);
  local_138 = in_RDX;
  local_120 = p;
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Simplex_handle *)(local_110 + 0x10),local_118,in_RDX,1.0);
  uVar9 = ((long)local_e8.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_e8.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_1b8.m_data = (double *)0x0;
  local_1b8.m_rows = 0;
  local_1b8.m_cols = 0;
  if (-1 < (long)(uVar9 | (ulong)pdVar1)) {
    if ((local_e8.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         local_e8.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start && pdVar1 != (double *)0x0) &&
       (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar3 / SEXT816((long)uVar9),0) < (long)pdVar1)) {
      puVar8 = (undefined8 *)
               __cxa_allocate_exception
                         (8,CONCAT71((int7)((uVar9 | (ulong)pdVar1) >> 8),pdVar1 == (double *)0x0),
                          SUB168(auVar3 % SEXT816((long)uVar9),0));
      *puVar8 = operator_delete;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_1b8,uVar9 * (long)pdVar1,(Index)pdVar1,uVar9);
    pvVar7 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)pdVar2 + 1);
    uVar9 = ((long)local_e8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_208.m_data = (double *)0x0;
    local_208.m_rows = 0;
    local_208.m_cols = 0;
    if (-1 < (long)(uVar9 | (ulong)pvVar7)) {
      if ((local_e8.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_e8.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start &&
           pvVar7 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) &&
         (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         SUB168(auVar3 / SEXT816((long)uVar9),0) < (long)pvVar7)) {
        puVar8 = (undefined8 *)
                 __cxa_allocate_exception
                           (8,CONCAT71((int7)((uVar9 | (ulong)pvVar7) >> 8),
                                       pvVar7 == (vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)0x0),SUB168(auVar3 % SEXT816((long)uVar9),0));
        *puVar8 = operator_delete;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_198 = pvVar7;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                (&local_208,uVar9 * (long)pvVar7,(Index)pvVar7,uVar9);
      if ((long)local_e8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_e8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        if (local_208.m_rows < 1) {
LAB_00127f1d:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
        lVar5 = ((long)local_e8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_e8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar12 = 0;
        pdVar10 = local_208.m_data;
        do {
          if (local_208.m_cols <= lVar12) goto LAB_00127f1d;
          *pdVar10 = 1.0;
          lVar12 = lVar12 + 1;
          pdVar10 = pdVar10 + local_208.m_rows;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar12);
      }
      Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::vertex_range((Vertex_range *)local_d0,
                     (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *)(local_110 + 0x10));
      local_1e8.o_it_._M_current =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._0_8_;
      local_1e8.o_end_._M_current =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._8_8_;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1e8.value_,(vector<int,_std::allocator<int>_> *)(local_d0 + 0x10));
      local_1e8.is_end_ = local_d0[0x28];
      local_168._0_8_ = local_a0._M_current;
      local_168._8_8_ = cStack_98._M_current;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(local_168 + 0x10),&local_90);
      local_140 = local_78;
      local_130 = this;
      local_128 = pdVar2;
      if ((local_1e8.is_end_ & local_78) == 0) {
        lVar5 = 0;
        lVar12 = 0;
        do {
          std::vector<int,_std::allocator<int>_>::vector(&local_180,&local_1e8.value_);
          Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::cartesian_coordinates
                    ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)local_190,local_118,1.0);
          Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)local_110,local_120);
          if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1 < local_198) {
            pdVar10 = (double *)local_190._8_8_;
            if ((long)local_190._8_8_ < 1) {
              pdVar10 = (double *)0x0;
            }
            pdVar13 = (double *)0x1;
            do {
              if ((long)pdVar13 - (long)pdVar10 == 1) goto LAB_00127f3c;
              if (((lVar12 < 0) || (local_208.m_rows <= (long)pdVar13)) ||
                 (local_208.m_cols <= lVar12)) goto LAB_00127f1d;
              *(undefined8 *)((long)local_208.m_data + (long)pdVar13 * 8 + local_208.m_rows * lVar5)
                   = *(undefined8 *)(local_190._0_8_ + (long)pdVar13 * 8 + -8);
              bVar14 = pdVar13 != pdVar2;
              pdVar13 = (double *)((long)pdVar13 + 1);
            } while (bVar14);
          }
          if (pdVar1 != (double *)0x0) {
            pdVar10 = (double *)local_110._8_8_;
            if ((long)local_110._8_8_ < 1) {
              pdVar10 = (double *)0x0;
            }
            pdVar13 = (double *)0x0;
            do {
              if (pdVar10 == pdVar13) goto LAB_00127f3c;
              if (((lVar12 < 0) || (local_1b8.m_rows <= (long)pdVar13)) ||
                 (local_1b8.m_cols <= lVar12)) goto LAB_00127f1d;
              *(undefined8 *)((long)local_1b8.m_data + (long)pdVar13 * 8 + local_1b8.m_rows * lVar5)
                   = *(undefined8 *)(local_110._0_8_ + (long)pdVar13 * 8);
              pdVar13 = (double *)((long)pdVar13 + 1);
            } while (pdVar1 != pdVar13);
          }
          free((void *)local_110._0_8_);
          free((void *)local_190._0_8_);
          if ((ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x0) {
            operator_delete(local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_1e8.is_end_ == false) {
            Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::update_value(&local_1e8);
            local_1e8.o_it_._M_current = local_1e8.o_it_._M_current + 1;
            if (local_1e8.o_it_._M_current == local_1e8.o_end_._M_current) {
              local_1e8.is_end_ = true;
            }
          }
          lVar12 = lVar12 + 1;
          lVar5 = lVar5 + 8;
        } while (((local_1e8.is_end_ & 1U) == 0) || ((local_140 & 1) == 0));
      }
      else {
        lVar12 = 0;
      }
      if ((pointer)local_168._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_168._16_8_,(long)local_148 - local_168._16_8_);
      }
      pdVar1 = local_128;
      if (local_1e8.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e8.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((double *)local_d0._16_8_ != (double *)0x0) {
        operator_delete((void *)local_d0._16_8_,local_d0._32_8_ - local_d0._16_8_);
      }
      pvVar7 = local_198;
      if (lVar12 != ((long)local_e8.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_e8.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
        __assert_fail("j == s.dimension() + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/include/gudhi/Functions/PL_approximation.h"
                      ,0x35,
                      "Eigen::VectorXd Gudhi::coxeter_triangulation::PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd, Gudhi::coxeter_triangulation::Coxeter_triangulation<>>::operator()(const Eigen::VectorXd &) const [Function_ = Gudhi::coxeter_triangulation::Function_Sm_in_Rd, Triangulation_ = Gudhi::coxeter_triangulation::Coxeter_triangulation<>]"
                     );
      }
      if ((long)local_198 < 0) {
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (local_198 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
LAB_00127f3c:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      if ((ulong)local_198 >> 0x3d != 0) {
LAB_00127f94:
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = operator_delete;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)malloc((long)local_198 * 8);
      if ((pdVar1 != (double *)0x0) && (((ulong)pvVar6 & 0xf) != 0)) {
LAB_00127fc2:
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pvVar6 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) goto LAB_00127f94;
      local_1e8.o_end_._M_current = pvVar7;
      (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
      local_1e8.o_it_._M_current = pvVar6;
      if (pdVar1 != (double *)0x0) {
        pdVar2 = (local_138->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        lVar5 = (local_138->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows;
        pdVar10 = (double *)0x1;
        do {
          if (lVar5 < (long)pdVar10) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          (&(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start)[(long)pdVar10] = (pointer)pdVar2[(long)pdVar10 + -1];
          bVar14 = pdVar10 != pdVar1;
          pdVar10 = (double *)((long)pdVar10 + 1);
        } while (bVar14);
      }
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d0,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_208);
      Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
      _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                 local_d0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1e8);
      local_168._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      local_168._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_d0;
      local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_1e8;
      if (-1 < (long)local_d0._16_8_) {
        pvVar7 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168._0_8_;
        if ((double *)local_d0._16_8_ != (double *)0x0) {
          if ((ulong)local_d0._16_8_ < (double *)0x2000000000000000) {
            pvVar7 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     malloc(local_d0._16_8_ * 8);
            if ((double *)local_d0._16_8_ != (double *)0x1 && ((ulong)pvVar7 & 0xf) != 0)
            goto LAB_00127fc2;
            if (pvVar7 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0)
            goto LAB_00127e02;
          }
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = operator_delete;
          __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
LAB_00127e02:
        local_168._0_8_ = pvVar7;
        local_168._8_8_ = local_d0._16_8_;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,__1,_1,_0,__1,_1> *)local_168,(SrcXprType *)&local_180,
              (assign_op<double,_double> *)local_190);
        free(local_68);
        free((void *)CONCAT71(uStack_77,local_78));
        free(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
        free(cStack_98._M_current);
        free((void *)CONCAT71(local_d0._41_7_,local_d0[0x28]));
        free((void *)local_d0._24_8_);
        free((void *)local_d0._0_8_);
        pPVar4 = local_130;
        if (local_1b8.m_cols != local_168._8_8_) {
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                        "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                       );
        }
        local_d0._0_8_ = &local_1b8;
        local_d0._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_130,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)local_d0);
        free((void *)local_168._0_8_);
        free(local_1e8.o_it_._M_current);
        free(local_208.m_data);
        free(local_1b8.m_data);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&local_e8);
        IVar11 = extraout_RDX;
        if ((void *)local_110._16_8_ != (void *)0x0) {
          operator_delete((void *)local_110._16_8_,(long)local_f0 - local_110._16_8_);
          IVar11 = extraout_RDX_00;
        }
        VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             IVar11;
        VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pPVar4;
        return (VectorXd)
               VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      }
      __function = 
      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00128062;
    }
  }
  __function = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00128062:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

Eigen::VectorXd operator()(const Eigen::VectorXd& p) const {
    std::size_t cod_d = this->cod_d();
    std::size_t amb_d = this->amb_d();
    auto s = tr_.locate_point(p);
    Eigen::MatrixXd matrix(cod_d, s.dimension() + 1);
    Eigen::MatrixXd vertex_matrix(amb_d + 1, s.dimension() + 1);
    for (std::size_t i = 0; i < s.dimension() + 1; ++i) vertex_matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : s.vertex_range()) {
      Eigen::VectorXd pt_v = tr_.cartesian_coordinates(v);
      Eigen::VectorXd fun_v = fun_(pt_v);
      for (std::size_t i = 1; i < amb_d + 1; ++i) vertex_matrix(i, j) = pt_v(i - 1);
      for (std::size_t i = 0; i < cod_d; ++i) matrix(i, j) = fun_v(i);
      j++;
    }
    assert(j == s.dimension() + 1);
    Eigen::VectorXd z(amb_d + 1);
    z(0) = 1;
    for (std::size_t i = 1; i < amb_d + 1; ++i) z(i) = p(i - 1);
    Eigen::VectorXd lambda = vertex_matrix.colPivHouseholderQr().solve(z);
    Eigen::VectorXd result = matrix * lambda;
    return result;
  }